

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_kfold_conv_knum_int_num(jit_State *J)

{
  double dVar1;
  int32_t k;
  double dVar2;
  
  dVar1 = *(double *)(ulong)(J->fold).left.field_1.op12;
  if ((((ulong)(J->fold).ins & 0x4000000) == 0) && ((char)(J->fold).ins.field_1.t.irt < '\0')) {
    dVar2 = (double)(int)dVar1;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      return 3;
    }
  }
  (J->fold).ins.i = (int)dVar1;
  return 2;
}

Assistant:

LJFOLD(CONV KNUM IRCONV_INT_NUM)
LJFOLDF(kfold_conv_knum_int_num)
{
  lua_Number n = knumleft;
  if (!(fins->op2 & IRCONV_TRUNC)) {
    int32_t k = lj_num2int(n);
    if (irt_isguard(fins->t) && n != (lua_Number)k) {
      /* We're about to create a guard which always fails, like CONV +1.5.
      ** Some pathological loops cause this during LICM, e.g.:
      **   local x,k,t = 0,1.5,{1,[1.5]=2}
      **   for i=1,200 do x = x+ t[k]; k = k == 1 and 1.5 or 1 end
      **   assert(x == 300)
      */
      return FAILFOLD;
    }
    return INTFOLD(k);
  } else {
    return INTFOLD((int32_t)n);
  }
}